

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void nn_queue_remove(nn_queue *self,nn_queue_item *item)

{
  nn_queue_item *local_28;
  nn_queue_item *prev;
  nn_queue_item *it;
  nn_queue_item *item_local;
  nn_queue *self_local;
  
  if (item->next != (nn_queue_item *)0xffffffffffffffff) {
    local_28 = (nn_queue_item *)0x0;
    for (prev = self->head; prev != (nn_queue_item *)0x0; prev = prev->next) {
      if (prev == item) {
        if (self->head == prev) {
          self->head = prev->next;
        }
        if (self->tail == prev) {
          self->tail = local_28;
        }
        if (local_28 != (nn_queue_item *)0x0) {
          local_28->next = prev->next;
        }
        item->next = (nn_queue_item *)0xffffffffffffffff;
        return;
      }
      local_28 = prev;
    }
  }
  return;
}

Assistant:

void nn_queue_remove (struct nn_queue *self, struct nn_queue_item *item)
{
    struct nn_queue_item *it;
    struct nn_queue_item *prev;

    if (item->next == NN_QUEUE_NOTINQUEUE)
        return;

    prev = NULL;
    for (it = self->head; it != NULL; it = it->next) {
        if (it == item) {
            if (self->head == it)
                self->head = it->next;
            if (self->tail == it)
                self->tail = prev;
            if (prev)
                prev->next = it->next;
            item->next = NN_QUEUE_NOTINQUEUE;
            return;
        }
        prev = it;
    }
}